

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O2

char * Map_LibraryReadFormulaStep(char *pFormula,char **pStrings,int *pnStrings)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  
  for (; cVar2 = *pFormula, cVar2 == ' '; pFormula = pFormula + 1) {
  }
  pcVar3 = pFormula;
  if (cVar2 == '\0') {
    __assert_fail("*pName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x107,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
  }
  do {
    pcVar1 = pcVar3 + 1;
    if (cVar2 == '\0') {
      lVar4 = 0;
LAB_00367ad6:
      *pnStrings = (int)lVar4;
      return pFormula;
    }
    if (cVar2 == '(') {
      *pcVar3 = '\0';
      iVar5 = 1;
      while ((cVar2 = pcVar3[1], cVar2 != '\0' && (iVar5 != 0))) {
        if (cVar2 == ')') {
          iVar5 = iVar5 + -1;
        }
        else if (cVar2 == '(') {
          iVar5 = iVar5 + 1;
        }
        pcVar3 = pcVar3 + 1;
      }
      if (iVar5 != 0) {
        __assert_fail("CountPars == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                      ,0x119,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
      }
      if (*pcVar3 != ')') {
        __assert_fail("*pPar2 == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                      ,0x11b,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
      }
      *pcVar3 = '\0';
      lVar4 = 0;
      do {
        pStrings[lVar4] = pcVar1;
        lVar4 = lVar4 + 1;
        iVar5 = 0;
        pcVar3 = pcVar1;
        while( true ) {
          pcVar1 = pcVar3 + 1;
          cVar2 = *pcVar3;
          if (cVar2 == '\0') goto LAB_00367ad6;
          if ((iVar5 == 0) && (cVar2 == ',')) break;
          pcVar3 = pcVar1;
          if (cVar2 == ')') {
            iVar5 = iVar5 + -1;
          }
          else if (cVar2 == '(') {
            iVar5 = iVar5 + 1;
          }
        }
        *pcVar3 = '\0';
      } while( true );
    }
    cVar2 = *pcVar1;
    pcVar3 = pcVar1;
  } while( true );
}

Assistant:

char * Map_LibraryReadFormulaStep( char * pFormula, char * pStrings[], int * pnStrings )
{
    char * pName, * pPar1, * pPar2, * pCur;
    int nStrings, CountPars;

    // skip leading spaces
    for ( pName = pFormula; *pName && *pName == ' '; pName++ );
    assert( *pName );
    // find the first opening parenthesis
    for ( pPar1 = pName; *pPar1 && *pPar1 != '('; pPar1++ );
    if ( *pPar1 == 0 )
    {
        *pnStrings = 0;
        return pName;
    }
    // overwrite it with space
    assert( *pPar1 == '(' );
    *pPar1 = 0;
    // find the corresponding closing parenthesis
    for ( CountPars = 1, pPar2 = pPar1 + 1; *pPar2 && CountPars; pPar2++ )
        if ( *pPar2 == '(' )
            CountPars++;
        else if ( *pPar2 == ')' )
            CountPars--;
    pPar2--;
    assert( CountPars == 0 );
    // overwrite it with space
    assert( *pPar2 == ')' );
    *pPar2 = 0;
    // save the intervals between the commas
    nStrings = 0;
    pCur = pPar1 + 1;
    while ( 1 )
    {
        // save the current string
        pStrings[ nStrings++ ] = pCur;
        // find the beginning of the next string
        for ( CountPars = 0; *pCur && (CountPars || *pCur != ','); pCur++ )
            if ( *pCur == '(' )
                CountPars++;
            else if ( *pCur == ')' )
                CountPars--;
        if ( *pCur == 0 )
            break;
        assert( *pCur == ',' );
        *pCur = 0;
        pCur++;
    }
    // save the results and return
    *pnStrings = nStrings;
    return pName;
}